

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *args_1;
  StructurePatternSyntax *pSVar1;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::StructurePatternMemberSyntax>
                     ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                      (__fn + 0x28),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StructurePatternSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,&local_40);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StructurePatternSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StructurePatternSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc)
    );
}